

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

Token * __thiscall
jsonnet::internal::anon_unknown_0::Parser::parseComprehensionSpecs
          (Parser *this,Kind end,Fodder *for_fodder,
          vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
          *specs)

{
  StaticError *this_00;
  LocationRange *location;
  string *msg;
  undefined8 uVar1;
  Kind in_EDX;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_RSI;
  Token *in_RDI;
  vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
  *in_R8;
  stringstream ss;
  AST *cond;
  AST *arr;
  Token in_token;
  Identifier *id;
  Token id_token;
  LocationRange l;
  Token *maybe_if;
  Token *in_stack_fffffffffffffa68;
  Kind v;
  Token *in_stack_fffffffffffffa70;
  Token *in_stack_fffffffffffffa78;
  LocationRange *in_stack_fffffffffffffa80;
  Parser *in_stack_fffffffffffffa88;
  Identifier **in_stack_fffffffffffffa90;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffffa98;
  UString *in_stack_fffffffffffffaa0;
  Allocator *in_stack_fffffffffffffaa8;
  vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
  *in_stack_fffffffffffffab0;
  AST **in_stack_fffffffffffffac0;
  AST *in_stack_fffffffffffffad0;
  AST *in_stack_fffffffffffffad8;
  undefined7 in_stack_fffffffffffffb10;
  undefined1 in_stack_fffffffffffffb17;
  stringstream local_4c8 [16];
  ostream local_4b8 [380];
  int local_33c;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *local_278;
  UString *pUStack_270;
  undefined8 local_268;
  undefined8 local_260;
  AST *local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined4 local_23c;
  AST *local_238;
  byte local_22d;
  undefined4 local_22c;
  AST *local_228;
  undefined8 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe54;
  undefined8 in_stack_fffffffffffffe58;
  
  do {
    LocationRange::LocationRange(in_stack_fffffffffffffa80);
    popExpect((Parser *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
              (char *)in_stack_fffffffffffffe48);
    Token::data32_abi_cxx11_(in_stack_fffffffffffffa68);
    Allocator::makeIdentifier(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
    std::__cxx11::u32string::~u32string
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               in_stack_fffffffffffffa70);
    popExpect((Parser *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
              (char *)in_stack_fffffffffffffe48);
    in_stack_fffffffffffffad8 =
         parse((Parser *)in_stack_fffffffffffffad8,(uint)((ulong)in_stack_fffffffffffffad0 >> 0x20))
    ;
    local_22c = 0;
    in_stack_fffffffffffffa68 = (Token *)&local_228;
    local_228 = in_stack_fffffffffffffad8;
    std::
    vector<jsonnet::internal::ComprehensionSpec,std::allocator<jsonnet::internal::ComprehensionSpec>>
    ::
    emplace_back<jsonnet::internal::ComprehensionSpec::Kind,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&>
              (in_stack_fffffffffffffab0,(Kind *)in_stack_fffffffffffffaa8,
               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                *)in_stack_fffffffffffffa88,in_stack_fffffffffffffac0);
    local_22d = 0;
    pop(in_stack_fffffffffffffa88);
    while (in_RDI->kind == IF) {
      in_stack_fffffffffffffad0 =
           parse((Parser *)in_stack_fffffffffffffad8,
                 (uint)((ulong)in_stack_fffffffffffffad0 >> 0x20));
      local_23c = 1;
      in_stack_fffffffffffffa98 =
           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            *)0x0;
      in_stack_fffffffffffffaa0 = (UString *)0x0;
      local_258 = (AST *)0x0;
      uStack_250 = 0;
      local_248 = 0;
      in_stack_fffffffffffffac0 = &local_258;
      in_stack_fffffffffffffab0 = in_R8;
      local_238 = in_stack_fffffffffffffad0;
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)0x29e21c);
      local_260 = 0;
      local_268 = 0;
      local_278 = in_stack_fffffffffffffa98;
      pUStack_270 = in_stack_fffffffffffffaa0;
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)0x29e253);
      in_stack_fffffffffffffa68 = (Token *)&local_238;
      std::
      vector<jsonnet::internal::ComprehensionSpec,std::allocator<jsonnet::internal::ComprehensionSpec>>
      ::
      emplace_back<jsonnet::internal::ComprehensionSpec::Kind,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>,jsonnet::internal::AST*&>
                (in_stack_fffffffffffffab0,(Kind *)in_stack_fffffffffffffaa8,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)in_stack_fffffffffffffa88,in_stack_fffffffffffffac0);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)in_stack_fffffffffffffa80);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)in_stack_fffffffffffffa80);
      pop(in_stack_fffffffffffffa88);
      Token::operator=(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      Token::~Token(in_stack_fffffffffffffa70);
    }
    if (in_RDI->kind == in_EDX) {
      local_22d = 1;
      local_33c = 1;
    }
    else {
      if (in_RDI->kind != FOR) {
        std::__cxx11::stringstream::stringstream(local_4c8);
        v = (Kind)((ulong)in_stack_fffffffffffffa68 >> 0x20);
        this_00 = (StaticError *)std::operator<<(local_4b8,"expected for, if or ");
        location = (LocationRange *)internal::operator<<((ostream *)in_stack_fffffffffffffa70,v);
        msg = (string *)std::operator<<((ostream *)location," after for clause, got: ");
        internal::operator<<((ostream *)msg,in_stack_fffffffffffffa78);
        uVar1 = __cxa_allocate_exception(0x60);
        std::__cxx11::stringstream::str();
        StaticError::StaticError(this_00,location,msg);
        __cxa_throw(uVar1,&StaticError::typeinfo,StaticError::~StaticError);
      }
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      operator=((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                 *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),in_RSI);
      local_33c = 0;
    }
    if ((local_22d & 1) == 0) {
      Token::~Token(in_stack_fffffffffffffa70);
    }
    Token::~Token(in_stack_fffffffffffffa70);
    Token::~Token(in_stack_fffffffffffffa70);
    LocationRange::~LocationRange((LocationRange *)0x29e5a3);
  } while (local_33c == 0);
  return in_RDI;
}

Assistant:

Token parseComprehensionSpecs(Token::Kind end, Fodder for_fodder,
                                  std::vector<ComprehensionSpec> &specs)
    {
        while (true) {
            LocationRange l;
            Token id_token = popExpect(Token::IDENTIFIER);
            const Identifier *id = alloc->makeIdentifier(id_token.data32());
            Token in_token = popExpect(Token::IN);
            AST *arr = parse(MAX_PRECEDENCE);
            specs.emplace_back(
                ComprehensionSpec::FOR, for_fodder, id_token.fodder, id, in_token.fodder, arr);

            Token maybe_if = pop();
            for (; maybe_if.kind == Token::IF; maybe_if = pop()) {
                AST *cond = parse(MAX_PRECEDENCE);
                specs.emplace_back(
                    ComprehensionSpec::IF, maybe_if.fodder, Fodder{}, nullptr, Fodder{}, cond);
            }
            if (maybe_if.kind == end) {
                return maybe_if;
            }
            if (maybe_if.kind != Token::FOR) {
                std::stringstream ss;
                ss << "expected for, if or " << end << " after for clause, got: " << maybe_if;
                throw StaticError(maybe_if.location, ss.str());
            }
            for_fodder = maybe_if.fodder;
        }
    }